

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcGen.c
# Opt level: O2

int Gia_ManTestSatEnum(Gia_Man_t *p)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Gia_Obj_t *pObj;
  word *pwVar2;
  long lVar3;
  abctime aVar4;
  abctime aVar5;
  ulong uVar6;
  abctime time;
  abctime time_00;
  Gia_Man_t *pGVar7;
  uint uVar8;
  long lVar9;
  Vec_Wrd_t *__ptr;
  uint uVar10;
  uint uVar11;
  char *pStr;
  uint uVar12;
  void *local_78;
  int iLit;
  sat_solver *local_58;
  Gia_Man_t *local_50;
  abctime local_48;
  ulong local_40;
  char *local_38;
  
  local_48 = Abc_Clock();
  p_00 = Mf_ManGenerateCnf(p,8,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_78 = malloc(4000);
  iLit = 2;
  local_58 = s;
  iVar1 = sat_solver_addclause(s,&iLit,(lit *)&local_58);
  if (iVar1 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcGen.c"
                  ,0x8f,"int Gia_ManTestSatEnum(Gia_Man_t *)");
  }
  Gia_ManMoFindSimulate(p,1);
  pObj = Gia_ManCo(p,0);
  iVar1 = Gia_ObjId(p,pObj);
  local_50 = p;
  Gia_ManMoObj(p,iVar1);
  for (iVar1 = 0; iVar1 != 0x40; iVar1 = iVar1 + 1) {
    printf("%d");
  }
  putchar(10);
  uVar12 = 1000;
  uVar8 = 0;
  pStr = (char *)0x0;
  uVar6 = 0;
  while (pGVar7 = local_50, (int)uVar6 != 0x40) {
    uVar11 = 0;
    local_40 = uVar6;
    local_38 = pStr;
    for (lVar9 = 0; lVar9 < pGVar7->nObjs; lVar9 = lVar9 + 1) {
      if (p_00->pVarNums[lVar9] != -1) {
        pwVar2 = Gia_ManMoObj(pGVar7,(int)lVar9);
        if ((*(uint *)((long)pwVar2 + (uVar6 >> 5) * 4) & 1 << ((byte)uVar6 & 0x1f)) != 0) {
          iVar1 = p_00->pVarNums[lVar9];
          if (uVar11 == uVar12) {
            uVar10 = uVar12 * 2;
            if ((int)uVar12 < 0x10) {
              uVar10 = 0x10;
            }
            if ((int)uVar12 < (int)uVar10) {
              if (local_78 == (void *)0x0) {
                local_78 = malloc((ulong)uVar10 << 2);
              }
              else {
                local_78 = realloc(local_78,(ulong)uVar10 << 2);
              }
              uVar12 = uVar10;
              if (local_78 == (void *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
          }
          lVar3 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          *(int *)((long)local_78 + lVar3 * 4) = iVar1;
          pGVar7 = local_50;
        }
      }
    }
    aVar4 = Abc_Clock();
    iVar1 = sat_solver_solve(local_58,(lit *)0x0,(lit *)0x0,0,0,0,0);
    aVar5 = Abc_Clock();
    pStr = local_38 + (aVar5 - aVar4);
    putchar((uint)(iVar1 != 1) * 2 + 0x2b);
    uVar8 = uVar8 + (iVar1 == 1);
    uVar6 = (ulong)((int)local_40 + 1);
  }
  putchar(10);
  printf("Finished generating %d assignments.  ",(ulong)uVar8);
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x7bf12c,(char *)(aVar4 - local_48),time);
  Abc_PrintTime(0x7bd0ad,pStr,time_00);
  __ptr = pGVar7->vSims;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      pGVar7->vSims->pArray = (word *)0x0;
      __ptr = pGVar7->vSims;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_0046c1a5;
    }
    free(__ptr);
    pGVar7->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_0046c1a5:
  free(local_78);
  sat_solver_delete(local_58);
  Cnf_DataFree(p_00);
  return 1;
}

Assistant:

int Gia_ManTestSatEnum( Gia_Man_t * p )
{
    abctime clk = Abc_Clock(), clk2, clkTotal = 0;
    Cnf_Dat_t * pCnf = Mf_ManGenerateCnf( p, 8, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    int i, v, status, iLit, nWords = 1, iOutVar = 1, Count = 0;
    Vec_Int_t * vVars = Vec_IntAlloc( 1000 );
    word * pSimInfo;

    // add literals to the solver
    iLit  = Abc_Var2Lit( iOutVar, 0 ); 
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );

    // simulate the AIG
    Gia_ManMoFindSimulate( p, nWords );

    // print outputs
    pSimInfo = Gia_ManMoObj( p, Gia_ObjId(p, Gia_ManCo(p, 0)) );
    for ( i = 0; i < 64*nWords; i++ )
        printf( "%d", Abc_InfoHasBit( (unsigned *)pSimInfo, i ) );
    printf( "\n" );

    // iterate through the assignments
    for ( i = 0; i < 64*nWords; i++ )
    {
        Vec_IntClear( vVars );
        for ( v = 0; v < Gia_ManObjNum(p); v++ )
        {
            if ( pCnf->pVarNums[v] == -1 )
                continue;
            pSimInfo = Gia_ManMoObj( p, v );
            if ( !Abc_InfoHasBit( (unsigned *)pSimInfo, i ) )
                continue;
            Vec_IntPush( vVars, pCnf->pVarNums[v] );
        }
        //sat_solver_act_var_clear( pSat );
        //sat_solver_set_polarity( pSat, Vec_IntArray(vVars), Vec_IntSize(vVars) );

        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        clkTotal += Abc_Clock() - clk2;
        printf( "%c", status == l_True ? '+' : '-' );
        if ( status == l_True )
            Count++;
    }
    printf( "\n" );
    printf( "Finished generating %d assignments.  ", Count );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Abc_PrintTime( 1, "SAT solver time", clkTotal );

    Vec_WrdFreeP( &p->vSims );
    Vec_IntFree( vVars );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return 1;
}